

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings settings)

{
  undefined8 uVar1;
  PromiseNode *pPVar2;
  PromiseFulfiller<void> *pPVar3;
  uint uVar4;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_> local_50;
  PromiseFulfillerPair<void> local_38;
  
  local_50.tag = 1;
  local_50.field_1.forceAligned = service;
  newPromiseAndFulfiller<void>();
  HttpServer(this,timer,requestHeaderTable,&local_50,settings,&local_38);
  pPVar3 = local_38.fulfiller.ptr;
  if (local_38.fulfiller.ptr != (PromiseFulfiller<void> *)0x0) {
    local_38.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    (**(local_38.fulfiller.disposer)->_vptr_Disposer)
              (local_38.fulfiller.disposer,
               pPVar3->_vptr_PromiseFulfiller[-2] + (long)&pPVar3->_vptr_PromiseFulfiller);
  }
  pPVar2 = local_38.promise.super_PromiseBase.node.ptr;
  if (local_38.promise.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_38.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_38.promise.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_38.promise.super_PromiseBase.node.disposer,
               pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  uVar1 = local_50.field_1._8_8_;
  uVar4 = 0;
  if (local_50.tag != 1) {
    uVar4 = local_50.tag;
  }
  if (uVar4 == 2) {
    local_50.tag = 0;
    if ((long *)local_50.field_1._8_8_ != (long *)0x0) {
      local_50.field_1._8_8_ = 0;
      (***local_50.field_1.forceAligned)
                (local_50.field_1.forceAligned,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    }
  }
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, HttpHeaderTable& requestHeaderTable, HttpService& service,
                       Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}